

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O2

string * __thiscall
cmCPackIFWGenerator::GetComponentInstallDirNameSuffix
          (string *__return_storage_ptr__,cmCPackIFWGenerator *this,string *componentName)

{
  mapped_type *component;
  cmAlphaNum *this_00;
  string prefix;
  string suffix;
  cmAlphaNum local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [64];
  cmAlphaNum local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"packages/",(allocator<char> *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_88 + 0x20),"/data",(allocator<char> *)&local_d8);
  if ((this->super_cmCPackGenerator).componentPackageMethod == ONE_PACKAGE) {
    local_d8.View_._M_len = local_a8._M_string_length;
    local_d8.View_._M_str = local_a8._M_dataplus._M_p;
    GetRootPackageName_abi_cxx11_((string *)local_88,this);
    local_48.View_._M_len = local_88._8_8_;
    local_48.View_._M_str = (char *)local_88._0_8_;
    cmStrCat<std::__cxx11::string>
              (__return_storage_ptr__,&local_d8,&local_48,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_88 + 0x20));
    this_00 = (cmAlphaNum *)local_88;
  }
  else {
    component = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
                ::operator[](&(this->super_cmCPackGenerator).Components,componentName);
    GetComponentPackageName_abi_cxx11_((string *)&local_48,this,component);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                   &local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_88 + 0x20));
    std::__cxx11::string::~string((string *)&local_d8);
    this_00 = &local_48;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)(local_88 + 0x20));
  std::__cxx11::string::~string((string *)&local_a8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackIFWGenerator::GetComponentInstallDirNameSuffix(
  const std::string& componentName)
{
  const std::string prefix = "packages/";
  const std::string suffix = "/data";

  if (this->componentPackageMethod == this->ONE_PACKAGE) {
    return cmStrCat(prefix, this->GetRootPackageName(), suffix);
  }

  return prefix +
    this->GetComponentPackageName(&this->Components[componentName]) + suffix;
}